

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data_pipelines.cpp
# Opt level: O2

void data_pipeline_2P_SP(size_t L,uint w)

{
  promise<void> *this;
  Node *pNVar1;
  FlowBuilder FVar2;
  array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>
  *__cur;
  pointer pcVar3;
  long *plVar4;
  pointer p_Var5;
  size_type sVar6;
  size_t sVar7;
  size_t *psVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  __allocator_type __a2;
  shared_ptr<tf::Topology> t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  atomic<unsigned_long> j2;
  size_t j1;
  ulong local_420;
  ulong local_418;
  size_t cnt;
  promise<void> promise;
  vector<int,_std::allocator<int>_> collection;
  size_type local_3c8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_3c0 [2];
  size_type local_3b0;
  ulong local_3a8;
  size_t local_3a0;
  Node *local_398;
  vector<int,_std::allocator<int>_> source;
  anon_class_32_4_5d790f4d local_378;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
  local_358;
  shared_ptr<tf::WorkerInterface> local_278;
  undefined8 local_268;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  mutex mutex;
  Taskflow taskflow;
  Executor executor;
  
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<int,_std::allocator<int>_>::vector(&source,100,(allocator_type *)&local_358);
  iVar10 = 0;
  for (; source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1) {
    *source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         iVar10;
    iVar10 = iVar10 + 1;
  }
  local_418 = L << 4;
  local_3b0 = L + 1;
  local_3a8 = L >> 0x3b;
  local_420 = 0;
  local_3a0 = L;
  while( true ) {
    if (100 < local_420) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&source.super__Vector_base<int,_std::allocator<int>_>);
      tf::Executor::~Executor(&executor);
      return;
    }
    tf::Taskflow::Taskflow(&taskflow);
    sVar11 = local_3a0;
    j1 = 0;
    j2.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    mutex.super___mutex_base._M_mutex._16_8_ = 0;
    mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    mutex.super___mutex_base._M_mutex.__align = 0;
    mutex.super___mutex_base._M_mutex._8_8_ = 0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_358._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cnt = 1;
    local_358._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_358._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>,_false>
    ._M_head_impl._type = PARALLEL;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>,_false>
    ._M_head_impl._callable.N = local_420;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>,_false>
    ._M_head_impl._callable.mutex = &mutex;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>,_false>
    ._M_head_impl._callable.j2 = &j2;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>,_false>
    ._M_head_impl._callable.L = local_3a0;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_false>
    ._M_head_impl._type = SERIAL;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_false>
    ._M_head_impl._callable.N = local_420;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_false>
    ._M_head_impl._callable.source = &source;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_false>
    ._M_head_impl._callable.j1 = &j1;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_false>
    ._M_head_impl._callable.L = local_3a0;
    local_358._meta._M_elems[0].type = SERIAL;
    local_358._meta._M_elems[1].type = PARALLEL;
    local_358._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>,_false>
    ._M_head_impl._callable.collection = &collection;
    if (local_3a8 != 0) break;
    local_358._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_358._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_358._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_3a0 == 0) {
      local_358._lines.
      super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_358._lines.
      super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(local_418);
    }
    local_358._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(local_358._lines.
                           super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                          super___atomic_base<unsigned_long>._M_i + local_418);
    local_358._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_358._lines.
         super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    sVar7 = sVar11;
    while (bVar13 = sVar7 != 0, sVar7 = sVar7 - 1, bVar13) {
      (local_358._lines.
       super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_358._lines.
       super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      local_358._lines.
      super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_358._lines.
           super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_358._tasks,local_3b0,(allocator_type *)&local_458);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_358._pipeflows,sVar11,(allocator_type *)&local_458);
    std::
    vector<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
    ::vector(&local_358._buffer,sVar11,(allocator_type *)&local_458);
    if (sVar11 == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                 ,0x180,(char (*) [28])"must have at least one line");
    }
    if (local_358._pipes.
        super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
        .
        super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_false>
        ._M_head_impl._type != SERIAL) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                 ,0x184,(char (*) [26])"first pipe must be serial");
    }
    local_358._num_tokens = 0;
    psVar8 = &(local_358._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
               _M_impl.super__Vector_impl_data._M_start)->_pipe;
    for (sVar11 = 0;
        ((long)local_358._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)local_358._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x60 != sVar11; sVar11 = sVar11 + 1) {
      *psVar8 = 0;
      ((Pipeflow *)(psVar8 + -1))->_line = sVar11;
      psVar8 = psVar8 + 0xc;
    }
    (local_358._lines.
     super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
    super___atomic_base<unsigned_long>._M_i = 0;
    lVar9 = 0x18;
    for (uVar12 = 1;
        uVar12 < (ulong)(((long)local_358._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_358._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar12 = uVar12 + 1) {
      *(long *)((long)&(local_358._lines.
                        super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar9) =
           (long)(int)local_358._meta._M_elems[1].type;
      lVar9 = lVar9 + 0x10;
    }
    (local_358._lines.
     super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1].join_counter.
    super___atomic_base<unsigned_long>._M_i = 1;
    lVar9 = 0x10;
    for (uVar12 = 1;
        uVar12 < (ulong)(((long)local_358._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_358._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar12 = uVar12 + 1) {
      *(long *)((long)&(local_358._lines.
                        super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar9) =
           (long)(int)local_358._meta._M_elems[0].type + -1;
      lVar9 = lVar9 + 0x10;
    }
    local_458._M_dataplus._M_p = (pointer)operator_new(0xd8);
    local_458._M_dataplus._M_p[0] = '\0';
    local_458._M_dataplus._M_p[1] = '\0';
    local_458._M_dataplus._M_p[2] = '\0';
    local_458._M_dataplus._M_p[3] = '\0';
    local_458._M_dataplus._M_p[4] = '\0';
    local_458._M_dataplus._M_p[5] = '\0';
    local_458._M_dataplus._M_p[6] = '\0';
    local_458._M_dataplus._M_p[7] = '\0';
    *(pointer *)(local_458._M_dataplus._M_p + 8) = local_458._M_dataplus._M_p + 0x18;
    local_458._M_dataplus._M_p[0x10] = '\0';
    local_458._M_dataplus._M_p[0x11] = '\0';
    local_458._M_dataplus._M_p[0x12] = '\0';
    local_458._M_dataplus._M_p[0x13] = '\0';
    local_458._M_dataplus._M_p[0x14] = '\0';
    local_458._M_dataplus._M_p[0x15] = '\0';
    local_458._M_dataplus._M_p[0x16] = '\0';
    local_458._M_dataplus._M_p[0x17] = '\0';
    local_458._M_dataplus._M_p[0x18] = '\0';
    local_458._M_dataplus._M_p[0x28] = '\0';
    local_458._M_dataplus._M_p[0x29] = '\0';
    local_458._M_dataplus._M_p[0x2a] = '\0';
    local_458._M_dataplus._M_p[0x2b] = '\0';
    local_458._M_dataplus._M_p[0x2c] = '\0';
    local_458._M_dataplus._M_p[0x2d] = '\0';
    local_458._M_dataplus._M_p[0x2e] = '\0';
    local_458._M_dataplus._M_p[0x2f] = '\0';
    local_458._M_dataplus._M_p[0x30] = '\0';
    local_458._M_dataplus._M_p[0x31] = '\0';
    local_458._M_dataplus._M_p[0x32] = '\0';
    local_458._M_dataplus._M_p[0x33] = '\0';
    local_458._M_dataplus._M_p[0x34] = '\0';
    local_458._M_dataplus._M_p[0x35] = '\0';
    local_458._M_dataplus._M_p[0x36] = '\0';
    local_458._M_dataplus._M_p[0x37] = '\0';
    local_458._M_dataplus._M_p[0x38] = '\0';
    local_458._M_dataplus._M_p[0x39] = '\0';
    local_458._M_dataplus._M_p[0x3a] = '\0';
    local_458._M_dataplus._M_p[0x3b] = '\0';
    local_458._M_dataplus._M_p[0x3c] = '\0';
    local_458._M_dataplus._M_p[0x3d] = '\0';
    local_458._M_dataplus._M_p[0x3e] = '\0';
    local_458._M_dataplus._M_p[0x3f] = '\0';
    local_458._M_dataplus._M_p[0x40] = '\0';
    local_458._M_dataplus._M_p[0x41] = '\0';
    local_458._M_dataplus._M_p[0x42] = '\0';
    local_458._M_dataplus._M_p[0x43] = '\0';
    local_458._M_dataplus._M_p[0x44] = '\0';
    local_458._M_dataplus._M_p[0x45] = '\0';
    local_458._M_dataplus._M_p[0x46] = '\0';
    local_458._M_dataplus._M_p[0x47] = '\0';
    *(pointer *)(local_458._M_dataplus._M_p + 0x48) = local_458._M_dataplus._M_p + 0x60;
    *(pointer *)(local_458._M_dataplus._M_p + 0x50) = local_458._M_dataplus._M_p + 0x60;
    *(pointer *)(local_458._M_dataplus._M_p + 0x58) = local_458._M_dataplus._M_p + 0x80;
    local_458._M_dataplus._M_p[0x80] = '\0';
    local_458._M_dataplus._M_p[0x81] = '\0';
    local_458._M_dataplus._M_p[0x82] = '\0';
    local_458._M_dataplus._M_p[0x83] = '\0';
    local_458._M_dataplus._M_p[0x84] = '\0';
    local_458._M_dataplus._M_p[0x85] = '\0';
    local_458._M_dataplus._M_p[0x86] = '\0';
    local_458._M_dataplus._M_p[0x87] = '\0';
    local_458._M_dataplus._M_p[0x90] = '\0';
    local_458._M_dataplus._M_p[0x91] = '\0';
    local_458._M_dataplus._M_p[0x92] = '\0';
    local_458._M_dataplus._M_p[0x93] = '\0';
    local_458._M_dataplus._M_p[0x94] = '\0';
    local_458._M_dataplus._M_p[0x95] = '\0';
    local_458._M_dataplus._M_p[0x96] = '\0';
    local_458._M_dataplus._M_p[0x97] = '\0';
    *(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
      **)(local_458._M_dataplus._M_p + 0x88) = &local_358;
    *(code **)(local_458._M_dataplus._M_p + 0xa0) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
         ::_M_invoke;
    *(code **)(local_458._M_dataplus._M_p + 0x98) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
         ::_M_manager;
    local_458._M_dataplus._M_p[0xc0] = '\x04';
    local_458._M_dataplus._M_p[200] = '\0';
    local_458._M_dataplus._M_p[0xc9] = '\0';
    local_458._M_dataplus._M_p[0xca] = '\0';
    local_458._M_dataplus._M_p[0xcb] = '\0';
    local_458._M_dataplus._M_p[0xcc] = '\0';
    local_458._M_dataplus._M_p[0xcd] = '\0';
    local_458._M_dataplus._M_p[0xce] = '\0';
    local_458._M_dataplus._M_p[0xcf] = '\0';
    local_458._M_dataplus._M_p[0xd0] = '\0';
    local_458._M_dataplus._M_p[0xd1] = '\0';
    local_458._M_dataplus._M_p[0xd2] = '\0';
    local_458._M_dataplus._M_p[0xd3] = '\0';
    local_458._M_dataplus._M_p[0xd4] = '\0';
    local_458._M_dataplus._M_p[0xd5] = '\0';
    local_458._M_dataplus._M_p[0xd6] = '\0';
    local_458._M_dataplus._M_p[0xd7] = '\0';
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_358,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
    pNVar1 = local_358._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"cond",(allocator<char> *)&local_378);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    (local_358._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar1;
    std::__cxx11::string::~string((string *)&local_458);
    for (uVar12 = 0; FVar2._graph = taskflow.super_FlowBuilder._graph,
        uVar12 < (ulong)(((long)local_358._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_358._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar12 = uVar12 + 1) {
      local_458._M_dataplus._M_p = (pointer)operator_new(0xd8);
      local_458._M_dataplus._M_p[0] = '\0';
      local_458._M_dataplus._M_p[1] = '\0';
      local_458._M_dataplus._M_p[2] = '\0';
      local_458._M_dataplus._M_p[3] = '\0';
      local_458._M_dataplus._M_p[4] = '\0';
      local_458._M_dataplus._M_p[5] = '\0';
      local_458._M_dataplus._M_p[6] = '\0';
      local_458._M_dataplus._M_p[7] = '\0';
      *(pointer *)(local_458._M_dataplus._M_p + 8) = local_458._M_dataplus._M_p + 0x18;
      local_458._M_dataplus._M_p[0x10] = '\0';
      local_458._M_dataplus._M_p[0x11] = '\0';
      local_458._M_dataplus._M_p[0x12] = '\0';
      local_458._M_dataplus._M_p[0x13] = '\0';
      local_458._M_dataplus._M_p[0x14] = '\0';
      local_458._M_dataplus._M_p[0x15] = '\0';
      local_458._M_dataplus._M_p[0x16] = '\0';
      local_458._M_dataplus._M_p[0x17] = '\0';
      local_458._M_dataplus._M_p[0x18] = '\0';
      local_458._M_dataplus._M_p[0x28] = '\0';
      local_458._M_dataplus._M_p[0x29] = '\0';
      local_458._M_dataplus._M_p[0x2a] = '\0';
      local_458._M_dataplus._M_p[0x2b] = '\0';
      local_458._M_dataplus._M_p[0x2c] = '\0';
      local_458._M_dataplus._M_p[0x2d] = '\0';
      local_458._M_dataplus._M_p[0x2e] = '\0';
      local_458._M_dataplus._M_p[0x2f] = '\0';
      local_458._M_dataplus._M_p[0x30] = '\0';
      local_458._M_dataplus._M_p[0x31] = '\0';
      local_458._M_dataplus._M_p[0x32] = '\0';
      local_458._M_dataplus._M_p[0x33] = '\0';
      local_458._M_dataplus._M_p[0x34] = '\0';
      local_458._M_dataplus._M_p[0x35] = '\0';
      local_458._M_dataplus._M_p[0x36] = '\0';
      local_458._M_dataplus._M_p[0x37] = '\0';
      local_458._M_dataplus._M_p[0x38] = '\0';
      local_458._M_dataplus._M_p[0x39] = '\0';
      local_458._M_dataplus._M_p[0x3a] = '\0';
      local_458._M_dataplus._M_p[0x3b] = '\0';
      local_458._M_dataplus._M_p[0x3c] = '\0';
      local_458._M_dataplus._M_p[0x3d] = '\0';
      local_458._M_dataplus._M_p[0x3e] = '\0';
      local_458._M_dataplus._M_p[0x3f] = '\0';
      local_458._M_dataplus._M_p[0x40] = '\0';
      local_458._M_dataplus._M_p[0x41] = '\0';
      local_458._M_dataplus._M_p[0x42] = '\0';
      local_458._M_dataplus._M_p[0x43] = '\0';
      local_458._M_dataplus._M_p[0x44] = '\0';
      local_458._M_dataplus._M_p[0x45] = '\0';
      local_458._M_dataplus._M_p[0x46] = '\0';
      local_458._M_dataplus._M_p[0x47] = '\0';
      *(pointer *)(local_458._M_dataplus._M_p + 0x48) = local_458._M_dataplus._M_p + 0x60;
      *(pointer *)(local_458._M_dataplus._M_p + 0x50) = local_458._M_dataplus._M_p + 0x60;
      *(pointer *)(local_458._M_dataplus._M_p + 0x58) = local_458._M_dataplus._M_p + 0x80;
      local_458._M_dataplus._M_p[0x80] = '\0';
      local_458._M_dataplus._M_p[0x81] = '\0';
      local_458._M_dataplus._M_p[0x82] = '\0';
      local_458._M_dataplus._M_p[0x83] = '\0';
      local_458._M_dataplus._M_p[0x84] = '\0';
      local_458._M_dataplus._M_p[0x85] = '\0';
      local_458._M_dataplus._M_p[0x86] = '\0';
      local_458._M_dataplus._M_p[0x87] = '\0';
      *(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
        **)(local_458._M_dataplus._M_p + 0x88) = &local_358;
      *(ulong *)(local_458._M_dataplus._M_p + 0x90) = uVar12;
      *(code **)(local_458._M_dataplus._M_p + 0xa0) =
           std::
           _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
           ::_M_invoke;
      *(code **)(local_458._M_dataplus._M_p + 0x98) =
           std::
           _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
           ::_M_manager;
      local_458._M_dataplus._M_p[0xc0] = '\x02';
      local_458._M_dataplus._M_p[200] = '\0';
      local_458._M_dataplus._M_p[0xc9] = '\0';
      local_458._M_dataplus._M_p[0xca] = '\0';
      local_458._M_dataplus._M_p[0xcb] = '\0';
      local_458._M_dataplus._M_p[0xcc] = '\0';
      local_458._M_dataplus._M_p[0xcd] = '\0';
      local_458._M_dataplus._M_p[0xce] = '\0';
      local_458._M_dataplus._M_p[0xcf] = '\0';
      local_458._M_dataplus._M_p[0xd0] = '\0';
      local_458._M_dataplus._M_p[0xd1] = '\0';
      local_458._M_dataplus._M_p[0xd2] = '\0';
      local_458._M_dataplus._M_p[0xd3] = '\0';
      local_458._M_dataplus._M_p[0xd4] = '\0';
      local_458._M_dataplus._M_p[0xd5] = '\0';
      local_458._M_dataplus._M_p[0xd6] = '\0';
      local_458._M_dataplus._M_p[0xd7] = '\0';
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)&local_358,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
      pNVar1 = local_358._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378,
                   "rt-",3);
      std::__cxx11::to_string((string *)&promise,uVar12);
      std::operator+(&local_458,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378
                     ,(string *)&promise);
      std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
      local_358._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12 + 1]._node = pNVar1;
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&promise);
      std::__cxx11::string::~string((string *)&local_378);
      tf::Task::precede<tf::Task&>
                (local_358._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_358._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar12 + 1);
    }
    local_458._M_dataplus._M_p = (pointer)operator_new(0xd8);
    local_458._M_dataplus._M_p[0] = '\0';
    local_458._M_dataplus._M_p[1] = '\0';
    local_458._M_dataplus._M_p[2] = '\0';
    local_458._M_dataplus._M_p[3] = '\0';
    local_458._M_dataplus._M_p[4] = '\0';
    local_458._M_dataplus._M_p[5] = '\0';
    local_458._M_dataplus._M_p[6] = '\0';
    local_458._M_dataplus._M_p[7] = '\0';
    *(pointer *)(local_458._M_dataplus._M_p + 8) = local_458._M_dataplus._M_p + 0x18;
    local_458._M_dataplus._M_p[0x10] = '\0';
    local_458._M_dataplus._M_p[0x11] = '\0';
    local_458._M_dataplus._M_p[0x12] = '\0';
    local_458._M_dataplus._M_p[0x13] = '\0';
    local_458._M_dataplus._M_p[0x14] = '\0';
    local_458._M_dataplus._M_p[0x15] = '\0';
    local_458._M_dataplus._M_p[0x16] = '\0';
    local_458._M_dataplus._M_p[0x17] = '\0';
    local_458._M_dataplus._M_p[0x18] = '\0';
    local_458._M_dataplus._M_p[0x28] = '\0';
    local_458._M_dataplus._M_p[0x29] = '\0';
    local_458._M_dataplus._M_p[0x2a] = '\0';
    local_458._M_dataplus._M_p[0x2b] = '\0';
    local_458._M_dataplus._M_p[0x2c] = '\0';
    local_458._M_dataplus._M_p[0x2d] = '\0';
    local_458._M_dataplus._M_p[0x2e] = '\0';
    local_458._M_dataplus._M_p[0x2f] = '\0';
    local_458._M_dataplus._M_p[0x30] = '\0';
    local_458._M_dataplus._M_p[0x31] = '\0';
    local_458._M_dataplus._M_p[0x32] = '\0';
    local_458._M_dataplus._M_p[0x33] = '\0';
    local_458._M_dataplus._M_p[0x34] = '\0';
    local_458._M_dataplus._M_p[0x35] = '\0';
    local_458._M_dataplus._M_p[0x36] = '\0';
    local_458._M_dataplus._M_p[0x37] = '\0';
    local_458._M_dataplus._M_p[0x38] = '\0';
    local_458._M_dataplus._M_p[0x39] = '\0';
    local_458._M_dataplus._M_p[0x3a] = '\0';
    local_458._M_dataplus._M_p[0x3b] = '\0';
    local_458._M_dataplus._M_p[0x3c] = '\0';
    local_458._M_dataplus._M_p[0x3d] = '\0';
    local_458._M_dataplus._M_p[0x3e] = '\0';
    local_458._M_dataplus._M_p[0x3f] = '\0';
    local_458._M_dataplus._M_p[0x40] = '\0';
    local_458._M_dataplus._M_p[0x41] = '\0';
    local_458._M_dataplus._M_p[0x42] = '\0';
    local_458._M_dataplus._M_p[0x43] = '\0';
    local_458._M_dataplus._M_p[0x44] = '\0';
    local_458._M_dataplus._M_p[0x45] = '\0';
    local_458._M_dataplus._M_p[0x46] = '\0';
    local_458._M_dataplus._M_p[0x47] = '\0';
    *(pointer *)(local_458._M_dataplus._M_p + 0x48) = local_458._M_dataplus._M_p + 0x60;
    *(pointer *)(local_458._M_dataplus._M_p + 0x50) = local_458._M_dataplus._M_p + 0x60;
    *(pointer *)(local_458._M_dataplus._M_p + 0x58) = local_458._M_dataplus._M_p + 0x80;
    local_458._M_dataplus._M_p[0x80] = '\0';
    local_458._M_dataplus._M_p[0x81] = '\0';
    local_458._M_dataplus._M_p[0x82] = '\0';
    local_458._M_dataplus._M_p[0x83] = '\0';
    local_458._M_dataplus._M_p[0x84] = '\0';
    local_458._M_dataplus._M_p[0x85] = '\0';
    local_458._M_dataplus._M_p[0x86] = '\0';
    local_458._M_dataplus._M_p[0x87] = '\0';
    *(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
      **)(local_458._M_dataplus._M_p + 0x88) = &local_358;
    local_458._M_dataplus._M_p[0xc0] = '\x06';
    local_458._M_dataplus._M_p[200] = '\0';
    local_458._M_dataplus._M_p[0xc9] = '\0';
    local_458._M_dataplus._M_p[0xca] = '\0';
    local_458._M_dataplus._M_p[0xcb] = '\0';
    local_458._M_dataplus._M_p[0xcc] = '\0';
    local_458._M_dataplus._M_p[0xcd] = '\0';
    local_458._M_dataplus._M_p[0xce] = '\0';
    local_458._M_dataplus._M_p[0xcf] = '\0';
    local_458._M_dataplus._M_p[0xd0] = '\0';
    local_458._M_dataplus._M_p[0xd1] = '\0';
    local_458._M_dataplus._M_p[0xd2] = '\0';
    local_458._M_dataplus._M_p[0xd3] = '\0';
    local_458._M_dataplus._M_p[0xd4] = '\0';
    local_458._M_dataplus._M_p[0xd5] = '\0';
    local_458._M_dataplus._M_p[0xd6] = '\0';
    local_458._M_dataplus._M_p[0xd7] = '\0';
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"module_of_datapipeline",(allocator<char> *)&local_378);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    local_398 = pNVar1;
    std::__cxx11::string::~string((string *)&local_458);
    FVar2 = taskflow.super_FlowBuilder;
    pcVar3 = (pointer)operator_new(0xd8);
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    *(pointer *)(pcVar3 + 8) = pcVar3 + 0x18;
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\0';
    pcVar3[0x28] = '\0';
    pcVar3[0x29] = '\0';
    pcVar3[0x2a] = '\0';
    pcVar3[0x2b] = '\0';
    pcVar3[0x2c] = '\0';
    pcVar3[0x2d] = '\0';
    pcVar3[0x2e] = '\0';
    pcVar3[0x2f] = '\0';
    pcVar3[0x30] = '\0';
    pcVar3[0x31] = '\0';
    pcVar3[0x32] = '\0';
    pcVar3[0x33] = '\0';
    pcVar3[0x34] = '\0';
    pcVar3[0x35] = '\0';
    pcVar3[0x36] = '\0';
    pcVar3[0x37] = '\0';
    pcVar3[0x38] = '\0';
    pcVar3[0x39] = '\0';
    pcVar3[0x3a] = '\0';
    pcVar3[0x3b] = '\0';
    pcVar3[0x3c] = '\0';
    pcVar3[0x3d] = '\0';
    pcVar3[0x3e] = '\0';
    pcVar3[0x3f] = '\0';
    pcVar3[0x40] = '\0';
    pcVar3[0x41] = '\0';
    pcVar3[0x42] = '\0';
    pcVar3[0x43] = '\0';
    pcVar3[0x44] = '\0';
    pcVar3[0x45] = '\0';
    pcVar3[0x46] = '\0';
    pcVar3[0x47] = '\0';
    *(pointer *)(pcVar3 + 0x48) = pcVar3 + 0x60;
    *(pointer *)(pcVar3 + 0x50) = pcVar3 + 0x60;
    *(pointer *)(pcVar3 + 0x58) = pcVar3 + 0x80;
    pcVar3[0x80] = '\0';
    pcVar3[0x81] = '\0';
    pcVar3[0x82] = '\0';
    pcVar3[0x83] = '\0';
    pcVar3[0x84] = '\0';
    pcVar3[0x85] = '\0';
    pcVar3[0x86] = '\0';
    pcVar3[0x87] = '\0';
    pcVar3[0x88] = '\0';
    pcVar3[0x89] = '\0';
    pcVar3[0x8a] = '\0';
    pcVar3[0x8b] = '\0';
    pcVar3[0x8c] = '\0';
    pcVar3[0x8d] = '\0';
    pcVar3[0x8e] = '\0';
    pcVar3[0x8f] = '\0';
    pcVar3[0x90] = '\0';
    pcVar3[0x91] = '\0';
    pcVar3[0x92] = '\0';
    pcVar3[0x93] = '\0';
    pcVar3[0x94] = '\0';
    pcVar3[0x95] = '\0';
    pcVar3[0x96] = '\0';
    pcVar3[0x97] = '\0';
    pcVar3[0x98] = '\0';
    pcVar3[0x99] = '\0';
    pcVar3[0x9a] = '\0';
    pcVar3[0x9b] = '\0';
    pcVar3[0x9c] = '\0';
    pcVar3[0x9d] = '\0';
    pcVar3[0x9e] = '\0';
    pcVar3[0x9f] = '\0';
    pcVar3[0xa0] = '\0';
    pcVar3[0xa1] = '\0';
    pcVar3[0xa2] = '\0';
    pcVar3[0xa3] = '\0';
    pcVar3[0xa4] = '\0';
    pcVar3[0xa5] = '\0';
    pcVar3[0xa6] = '\0';
    pcVar3[0xa7] = '\0';
    plVar4 = (long *)operator_new(0x30);
    *plVar4 = (long)&j1;
    plVar4[1] = (long)&local_420;
    plVar4[2] = (long)&j2;
    plVar4[3] = (long)&collection;
    plVar4[4] = (long)&local_358;
    plVar4[5] = (long)&cnt;
    *(long **)(pcVar3 + 0x88) = plVar4;
    *(code **)(pcVar3 + 0xa0) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:305:34)>
         ::_M_invoke;
    *(code **)(pcVar3 + 0x98) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:305:34)>
         ::_M_manager;
    pcVar3[0xc0] = '\x01';
    pcVar3[200] = '\0';
    pcVar3[0xc9] = '\0';
    pcVar3[0xca] = '\0';
    pcVar3[0xcb] = '\0';
    pcVar3[0xcc] = '\0';
    pcVar3[0xcd] = '\0';
    pcVar3[0xce] = '\0';
    pcVar3[0xcf] = '\0';
    pcVar3[0xd0] = '\0';
    pcVar3[0xd1] = '\0';
    pcVar3[0xd2] = '\0';
    pcVar3[0xd3] = '\0';
    pcVar3[0xd4] = '\0';
    pcVar3[0xd5] = '\0';
    pcVar3[0xd6] = '\0';
    pcVar3[0xd7] = '\0';
    local_458._M_dataplus._M_p = pcVar3;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_458);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"test",(allocator<char> *)&local_378);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    std::__cxx11::string::~string((string *)&local_458);
    tf::Node::_precede(local_398,pNVar1);
    local_378.j1 = &j1;
    local_378.j2 = &j2;
    local_378.cnt = &cnt;
    local_378.collection = &collection;
    tf::Executor::_increment_topology(&executor);
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      data_pipeline_2P_SP::anon_class_32_4_5d790f4d::operator()(&local_378);
      std::promise<void>::promise(&promise);
      std::promise<void>::set_value(&promise);
      tf::Executor::_decrement_topology(&executor);
      std::__basic_future<void>::__basic_future((__basic_future<void> *)&t,(__state_type *)&promise)
      ;
      local_458._M_dataplus._M_p =
           (pointer)t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_458._M_string_length =
           (size_type)
           t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_458.field_2._M_allocated_capacity = 0;
      local_458.field_2._8_8_ = 0;
      local_268 = 0;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_260);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::promise<void>::~promise(&promise);
    }
    else {
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      p_Var5 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&__a2;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00171cb0;
      (p_Var5->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&taskflow;
      this = (promise<void> *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = &p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::promise<void>::promise(this);
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = 2;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x38) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x48) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x50) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x58) = 0;
      plVar4 = (long *)operator_new(0x20);
      plVar4[2] = (long)local_378.collection;
      plVar4[3] = (long)local_378.cnt;
      *plVar4 = (long)local_378.j1;
      plVar4[1] = (long)local_378.j2;
      *(long **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = plVar4;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x58) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:318:33)>
           ::_M_invoke;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x50) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:318:33)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x60) = 0;
      *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x68) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x70) = 0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&p_Var5->_M_impl;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           &p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&promise);
      std::__basic_future<void>::__basic_future
                ((__basic_future<void> *)&promise,(__state_type *)this);
      std::__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<tf::Topology,void>
                ((__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2> *)&local_3c8,
                 &t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      local_458._M_dataplus._M_p =
           (pointer)promise._M_future.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      local_458._M_string_length =
           (size_type)
           promise._M_future.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_458.field_2._M_allocated_capacity = local_3c8;
      local_458.field_2._8_8_ = a_Stack_3c0[0]._M_pi;
      local_3c8 = 0;
      a_Stack_3c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(a_Stack_3c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&promise._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::mutex::lock(&taskflow._mutex);
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back(&taskflow._topologies.c,
                (value_type *)&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      sVar6 = std::
              deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
              ::size(&taskflow._topologies.c);
      if (sVar6 == 1) {
        tf::Executor::_set_up_topology
                  (&executor,*(Worker **)(in_FS_OFFSET + -8),
                   t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&taskflow._mutex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::future<void>::get((future<void> *)&local_458);
    tf::Future<void>::~Future((Future<void> *)&local_458);
    tf::
    DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>
    ::~DataPipeline(&local_358);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&collection.super__Vector_base<int,_std::allocator<int>_>);
    tf::Taskflow::~Taskflow(&taskflow);
    local_420 = local_420 + 1;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

void data_pipeline_2P_SP(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  // std::vector<std::array<int, 2>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::DataPipeline pl(L,
      tf::make_data_pipe<tf::Pipeflow&, int>(tf::PipeType::SERIAL, [N, &source, &j1, L](auto& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return 0;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        // mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        // j1++;
        return source[j1++] + 1;
      }),

      tf::make_data_pipe<int, void>(tf::PipeType::PARALLEL,
      [N, &collection, &mutex, &j2, L](int& input, tf::Pipeflow& pf) mutable {
        REQUIRE(j2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex);
          REQUIRE(pf.token() % L == pf.line());
          // collection.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
          collection.push_back(input);
        }
      })
    );

    auto datapipeline = taskflow.composed_of(pl).name("module_of_datapipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);

      std::sort(collection.begin(), collection.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);
    }).name("test");

    datapipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = 0;
      collection.clear();
      // for(size_t i = 0; i < mybuffer.size(); ++i){
      //   for(size_t j = 0; j < mybuffer[0].size(); ++j){
      //     mybuffer[i][j] = 0;
      //   }
      // }
      cnt++;
    }).get();
  }
}